

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O0

void __thiscall
SimpleStringInternalCache::releaseNonCachedMemory
          (SimpleStringInternalCache *this,char *memory,size_t size)

{
  SimpleStringMemoryBlock *pSVar1;
  SimpleStringMemoryBlock *blockToFree;
  SimpleStringMemoryBlock *block_1;
  SimpleStringMemoryBlock *block;
  size_t size_local;
  char *memory_local;
  SimpleStringInternalCache *this_local;
  
  if ((this->nonCachedAllocations_ == (SimpleStringMemoryBlock *)0x0) ||
     (this->nonCachedAllocations_->memory_ != memory)) {
    for (blockToFree = this->nonCachedAllocations_; blockToFree != (SimpleStringMemoryBlock *)0x0;
        blockToFree = blockToFree->next_) {
      if ((blockToFree->next_ != (SimpleStringMemoryBlock *)0x0) &&
         (blockToFree->next_->memory_ == memory)) {
        pSVar1 = blockToFree->next_;
        blockToFree->next_ = blockToFree->next_->next_;
        destroySimpleStringMemoryBlock(this,pSVar1,size);
        return;
      }
    }
    printDeallocatingUnknownMemory(this,memory);
  }
  else {
    pSVar1 = this->nonCachedAllocations_;
    this->nonCachedAllocations_ = pSVar1->next_;
    destroySimpleStringMemoryBlock(this,pSVar1,size);
  }
  return;
}

Assistant:

void SimpleStringInternalCache::releaseNonCachedMemory(char* memory, size_t size)
{
    if (nonCachedAllocations_ && nonCachedAllocations_->memory_ == memory) {
        SimpleStringMemoryBlock* block = nonCachedAllocations_;
        nonCachedAllocations_ = block->next_;
        destroySimpleStringMemoryBlock(block, size);
        return;
    }

    for (SimpleStringMemoryBlock* block = nonCachedAllocations_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            destroySimpleStringMemoryBlock(blockToFree, size);
            return;
        }
    }

    printDeallocatingUnknownMemory(memory);
}